

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudotopoorder.cpp
# Opt level: O2

void __thiscall PseudoTopoOrder::FillDP(PseudoTopoOrder *this)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  DiGraph *pDVar4;
  pointer pvVar5;
  pointer pNVar6;
  pointer piVar7;
  pointer piVar8;
  ostream *poVar9;
  pointer piVar10;
  int iVar11;
  int iVar12;
  pointer pNVar13;
  int iVar14;
  double dVar15;
  
  piVar2 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar3 = (this->pto).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  iVar12 = this->first_unknown;
  if (this->best_index < iVar12) {
    piVar10 = (this->dynamic_programming).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar11 = piVar10[this->best_index];
  }
  else {
    piVar10 = (this->dynamic_programming).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar11 = 0;
  }
  pDVar4 = this->m_parent;
  while (iVar12 < (int)((ulong)((long)piVar3 - (long)piVar2) >> 2)) {
    iVar1 = piVar2[iVar12];
    piVar10[iVar12] = 0;
    pvVar5 = (pDVar4->m_ingraph).
             super__Vector_base<std::vector<NeighborNode,_std::allocator<NeighborNode>_>,_std::allocator<std::vector<NeighborNode,_std::allocator<NeighborNode>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar6 = *(pointer *)
              ((long)&pvVar5[iVar1].super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>.
                      _M_impl.super__Vector_impl_data + 8);
    piVar7 = (this->pto_inverse).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (this->best_parent).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (pNVar13 = pvVar5[iVar1].super__Vector_base<NeighborNode,_std::allocator<NeighborNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pNVar13 != pNVar6;
        pNVar13 = pNVar13 + 1) {
      iVar12 = piVar7[(*pNVar13).node];
      iVar1 = this->first_unknown;
      if ((iVar12 < iVar1) &&
         (iVar14 = (*pNVar13).weight + piVar10[iVar12], piVar10[iVar1] < iVar14)) {
        piVar10[iVar1] = iVar14;
        piVar8[this->first_unknown] = iVar12;
        if (iVar11 < iVar14) {
          this->best_index = this->first_unknown;
          iVar11 = iVar14;
        }
      }
    }
    iVar12 = this->first_unknown + 1;
    this->first_unknown = iVar12;
  }
  if (this->global_best < iVar11) {
    poVar9 = std::operator<<((ostream *)&std::cout,"PTO improved path to ");
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,iVar11);
    std::operator<<(poVar9," at ");
    dVar15 = TimeFromStart();
    poVar9 = std::ostream::_M_insert<double>(dVar15);
    std::endl<char,std::char_traits<char>>(poVar9);
    this->global_best = iVar11;
  }
  return;
}

Assistant:

void PseudoTopoOrder::FillDP()
{
	int n = pto.size();
	int best_val = 0;

	if (best_index < first_unknown)
	{
		best_val = dynamic_programming[best_index];
	}

// 	std::cout << "\nAt the beginning of filldp, first unknown: " << first_unknown << "/" << n << " and value of bestindex = " << dynamic_programming[best_index] << std::endl;
	for ( ; first_unknown < n; ++first_unknown)
	{
		int u = pto[first_unknown];
		dynamic_programming[first_unknown] = 0;

		auto& neigh = m_parent.inneighbors(u);

		for (auto v : neigh)
		{
			auto j = pto_inverse[v];

			if (first_unknown <= j)   // should be ignored
			{
				continue;
			}

			auto candidate = dynamic_programming[j] + v.Weight();

			if (candidate > dynamic_programming[first_unknown])
			{
				dynamic_programming[first_unknown] = candidate;
				best_parent[first_unknown] = j;

				if (candidate > best_val)
				{
// 					cout << "Fill: new best value at " << i << " with value " << best_val << endl;
					best_val = candidate;
					best_index = first_unknown;
				}
			}
		}
	}
	if (best_val > global_best)
	{
		std::cout << "PTO improved path to " << best_val << " at " << TimeFromStart() << std::endl;
		global_best = best_val;
	}

// 	std::cout << "\nreturning value: " << best_val << " = " << dynamic_programming[best_index] << std::endl;
}